

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_getsessionid(Curl_cfilter *cf,Curl_easy *data,void **ssl_sessionid,size_t *idsize)

{
  void *pvVar1;
  connectdata *pcVar2;
  Curl_share *pCVar3;
  Curl_ssl_session *pCVar4;
  char *second;
  _Bool _Var5;
  int iVar6;
  connectdata *pcVar7;
  ConnectBits CVar8;
  ssl_primary_config *c2;
  long lVar9;
  long *plVar10;
  ssl_config_data *psVar11;
  long lVar12;
  ulong uVar13;
  
  lVar12 = 0x1c0;
  psVar11 = &(data->set).ssl;
  if (cf->cft == &Curl_cft_ssl_proxy) {
    lVar12 = 0x230;
    psVar11 = &(data->set).proxy_ssl;
  }
  pvVar1 = cf->ctx;
  pcVar2 = cf->conn;
  *ssl_sessionid = (void *)0x0;
  if ((((psVar11->primary).field_0x69 & 8) != 0) &&
     ((data->state).session != (Curl_ssl_session *)0x0)) {
    pCVar3 = data->share;
    if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
      plVar10 = &(data->state).sessionage;
    }
    else {
      plVar10 = &pCVar3->sessionage;
    }
    if ((data->set).general_ssl.max_ssl_sessions != 0) {
      lVar9 = 0x38;
      uVar13 = 0;
      do {
        pCVar4 = (data->state).session;
        if ((*(long *)((long)pCVar4 + lVar9 + -0x20) != 0) &&
           (iVar6 = curl_strequal(*(char **)((long)pvVar1 + 8),
                                  *(char **)((long)pCVar4 + lVar9 + -0x38)), iVar6 != 0)) {
          pcVar7 = cf->conn;
          CVar8 = pcVar7->bits;
          second = *(char **)((long)pCVar4 + lVar9 + -0x30);
          if (((uint)CVar8 >> 9 & 1) == 0) {
            if (second == (char *)0x0) {
LAB_00684853:
              iVar6 = *(int *)((long)pCVar4 + lVar9 + -4);
              if (((uint)CVar8 >> 10 & 1) == 0) {
                if (iVar6 == -1) {
LAB_00684872:
                  if (((*(int *)((long)pvVar1 + 0x50) == *(int *)((long)pCVar4 + lVar9 + -8)) &&
                      (iVar6 = curl_strequal(pcVar7->handler->scheme,
                                             *(char **)((long)pCVar4 + lVar9 + -0x28)), iVar6 != 0))
                     && (_Var5 = match_ssl_primary_config
                                           ((Curl_easy *)((long)&(pcVar2->bundle_node).ptr + lVar12)
                                            ,(ssl_primary_config *)((long)&pCVar4->name + lVar9),c2)
                        , _Var5)) {
                    lVar12 = *plVar10;
                    *plVar10 = lVar12 + 1;
                    *(long *)((long)pCVar4 + lVar9 + -0x10) = lVar12 + 1;
                    *ssl_sessionid = *(void **)((long)pCVar4 + lVar9 + -0x20);
                    if (idsize != (size_t *)0x0) {
                      *idsize = *(size_t *)((long)pCVar4 + lVar9 + -0x18);
                    }
                    return false;
                  }
                }
              }
              else if ((iVar6 != -1) && (pcVar7->conn_to_port == iVar6)) goto LAB_00684872;
            }
          }
          else if ((second != (char *)0x0) &&
                  (iVar6 = curl_strequal((pcVar7->conn_to_host).name,second), iVar6 != 0)) {
            pcVar7 = cf->conn;
            CVar8 = pcVar7->bits;
            goto LAB_00684853;
          }
        }
        uVar13 = uVar13 + 1;
        lVar9 = lVar9 + 0xa8;
      } while (uVar13 < (data->set).general_ssl.max_ssl_sessions);
    }
  }
  return true;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           void **ssl_sessionid,
                           size_t *idsize) /* set 0 if unknown */
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  *ssl_sessionid = NULL;
  if(!ssl_config)
    return TRUE;

  DEBUGASSERT(ssl_config->primary.sessionid);

  if(!ssl_config->primary.sessionid || !data->state.session)
    /* session ID reuse is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(connssl->peer.hostname, check->name) &&
       ((!cf->conn->bits.conn_to_host && !check->conn_to_host) ||
        (cf->conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(cf->conn->conn_to_host.name, check->conn_to_host))) &&
       ((!cf->conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (cf->conn->bits.conn_to_port && check->conn_to_port != -1 &&
         cf->conn->conn_to_port == check->conn_to_port)) &&
       (connssl->port == check->remote_port) &&
       strcasecompare(cf->conn->handler->scheme, check->scheme) &&
       match_ssl_primary_config(data, conn_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  DEBUGF(infof(data, "%s Session ID in cache for %s %s://%s:%d",
               no_match? "Didn't find": "Found",
               Curl_ssl_cf_is_proxy(cf) ? "proxy" : "host",
               cf->conn->handler->scheme, connssl->peer.hostname,
               connssl->port));
  return no_match;
}